

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEditor.cc
# Opt level: O1

void __thiscall GraphEditor::apply_all(GraphEditor *this)

{
  sgNodeID_t *psVar1;
  WorkSpace *pWVar2;
  undefined8 uVar3;
  sgNodeID_t sVar4;
  pointer pGVar5;
  pointer pGVar6;
  long n;
  ulong uVar7;
  pointer pGVar8;
  long lVar9;
  pointer pLVar10;
  uint64_t uVar11;
  GraphEditorLinkDeletion *op;
  pointer pGVar12;
  undefined1 local_d8 [40];
  uint64_t local_b0;
  pointer local_a8;
  pointer local_a0;
  pointer local_98;
  int32_t local_90;
  int32_t local_8c;
  string local_88;
  string local_68;
  vector<long,_std::allocator<long>_> local_48;
  
  if (this->next_op != 0) {
    pGVar8 = (this->path_detachment_queue).
             super__Vector_base<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pGVar6 = (this->node_expansion_queue).
             super__Vector_base<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pGVar5 = (this->node_deletion_queue).
             super__Vector_base<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pGVar12 = (this->link_deletion_queue).
              super__Vector_base<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar11 = 0;
    do {
      if ((pGVar5 != (this->node_deletion_queue).
                     super__Vector_base<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>
                     ._M_impl.super__Vector_impl_data._M_finish) &&
         ((pGVar5->super_GraphEditorOperation).index == uVar11)) {
        lVar9 = *(pGVar5->super_GraphEditorOperation).input_nodes.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        n = -lVar9;
        if (0 < lVar9) {
          n = lVar9;
        }
        SequenceDistanceGraph::remove_node(&this->ws->sdg,n);
        pGVar5 = pGVar5 + 1;
      }
      if ((pGVar12 !=
           (this->link_deletion_queue).
           super__Vector_base<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>.
           _M_impl.super__Vector_impl_data._M_finish) &&
         ((pGVar12->super_GraphEditorOperation).index == uVar11)) {
        psVar1 = (pGVar12->super_GraphEditorOperation).input_ends.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        DistanceGraph::remove_link((DistanceGraph *)this->ws,*psVar1,psVar1[1]);
        pGVar12 = pGVar12 + 1;
      }
      if ((pGVar6 != (this->node_expansion_queue).
                     super__Vector_base<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>
                     ._M_impl.super__Vector_impl_data._M_finish) &&
         ((pGVar6->super_GraphEditorOperation).index == uVar11)) {
        local_b0 = uVar11;
        local_a8 = pGVar12;
        local_a0 = pGVar5;
        local_98 = pGVar8;
        if (8 < (ulong)((long)(pGVar6->super_GraphEditorOperation).input_ends.
                              super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(pGVar6->super_GraphEditorOperation).input_ends.
                             super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start)) {
          lVar9 = 0;
          uVar7 = 0;
          do {
            pWVar2 = this->ws;
            SequenceDistanceGraph::get_node_sequence_abi_cxx11_
                      (&local_68,&pWVar2->sdg,
                       *(pGVar6->super_GraphEditorOperation).input_nodes.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
            sVar4 = SequenceDistanceGraph::add_node(&pWVar2->sdg,&local_68,true);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            DistanceGraph::get_link
                      ((Link *)local_d8,(DistanceGraph *)this->ws,
                       *(sgNodeID_t *)
                        ((long)(pGVar6->super_GraphEditorOperation).input_ends.
                               super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar9),
                       *(pGVar6->super_GraphEditorOperation).input_nodes.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
            DistanceGraph::add_link
                      ((DistanceGraph *)this->ws,
                       *(sgNodeID_t *)
                        ((long)(pGVar6->super_GraphEditorOperation).input_ends.
                               super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar9),sVar4,local_d8._16_4_,
                       (Support)ZEXT816(0));
            DistanceGraph::get_link
                      ((Link *)local_d8,(DistanceGraph *)this->ws,
                       -*(pGVar6->super_GraphEditorOperation).input_nodes.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start,
                       *(sgNodeID_t *)
                        ((long)(pGVar6->super_GraphEditorOperation).input_ends.
                               super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar9 + 8));
            DistanceGraph::add_link
                      ((DistanceGraph *)this->ws,-sVar4,
                       *(sgNodeID_t *)
                        ((long)(pGVar6->super_GraphEditorOperation).input_ends.
                               super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar9 + 8),local_d8._16_4_,
                       (Support)ZEXT816(0));
            uVar7 = uVar7 + 1;
            lVar9 = lVar9 + 0x10;
          } while (uVar7 < (ulong)((long)(pGVar6->super_GraphEditorOperation).input_ends.
                                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                   (long)(pGVar6->super_GraphEditorOperation).input_ends.
                                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                         super__Vector_impl_data._M_start >> 3) >> 1);
        }
        SequenceDistanceGraph::remove_node
                  (&this->ws->sdg,
                   *(pGVar6->super_GraphEditorOperation).input_nodes.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start);
        pGVar6 = pGVar6 + 1;
        pGVar5 = local_a0;
        pGVar8 = local_98;
        uVar11 = local_b0;
        pGVar12 = local_a8;
      }
      if ((pGVar8 != (this->path_detachment_queue).
                     super__Vector_base<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>
                     ._M_impl.super__Vector_impl_data._M_finish) &&
         ((pGVar8->super_GraphEditorOperation).index == uVar11)) {
        if ((pGVar8->super_GraphEditorOperation).input_nodes.
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
            == (pGVar8->super_GraphEditorOperation).input_nodes.
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_finish) {
          if (pGVar8->full_detach == true) {
            local_b0 = uVar11;
            local_a8 = pGVar12;
            local_a0 = pGVar5;
            DistanceGraph::get_fw_links
                      ((vector<Link,_std::allocator<Link>_> *)local_d8,(DistanceGraph *)this->ws,
                       -*(pGVar8->super_GraphEditorOperation).input_ends.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start);
            uVar3 = local_d8._8_8_;
            for (pLVar10 = (pointer)local_d8._0_8_; pLVar10 != (pointer)uVar3; pLVar10 = pLVar10 + 1
                ) {
              if (pLVar10->dest !=
                  (pGVar8->super_GraphEditorOperation).input_ends.
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                  _M_start[1]) {
                DistanceGraph::remove_link((DistanceGraph *)this->ws,pLVar10->source,pLVar10->dest);
              }
            }
            if ((pointer)local_d8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_d8._0_8_,
                              CONCAT44(local_d8._20_4_,local_d8._16_4_) - local_d8._0_8_);
            }
            DistanceGraph::get_bw_links
                      ((vector<Link,_std::allocator<Link>_> *)local_d8,(DistanceGraph *)this->ws,
                       (pGVar8->super_GraphEditorOperation).input_ends.
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start[1]);
            uVar3 = local_d8._8_8_;
            for (pLVar10 = (pointer)local_d8._0_8_; pLVar10 != (pointer)uVar3; pLVar10 = pLVar10 + 1
                ) {
              if (pLVar10->dest !=
                  *(pGVar8->super_GraphEditorOperation).input_ends.
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start) {
                DistanceGraph::remove_link((DistanceGraph *)this->ws,pLVar10->source,pLVar10->dest);
              }
            }
            pGVar5 = local_a0;
            uVar11 = local_b0;
            pGVar12 = local_a8;
            if ((pointer)local_d8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_d8._0_8_,
                              CONCAT44(local_d8._20_4_,local_d8._16_4_) - local_d8._0_8_);
              pGVar5 = local_a0;
              uVar11 = local_b0;
              pGVar12 = local_a8;
            }
          }
        }
        else {
          pWVar2 = this->ws;
          local_b0 = uVar11;
          local_a8 = pGVar12;
          local_a0 = pGVar5;
          std::vector<long,_std::allocator<long>_>::vector
                    (&local_48,&(pGVar8->super_GraphEditorOperation).input_nodes);
          std::vector<long,_std::allocator<long>_>::vector
                    ((vector<long,_std::allocator<long>_> *)local_d8,&local_48);
          local_d8._24_8_ = pWVar2;
          SequenceDistanceGraphPath::sequence_abi_cxx11_
                    (&local_88,(SequenceDistanceGraphPath *)local_d8);
          sVar4 = SequenceDistanceGraph::add_node(&pWVar2->sdg,&local_88,true);
          uVar11 = local_b0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((pointer)local_d8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_d8._0_8_,
                            CONCAT44(local_d8._20_4_,local_d8._16_4_) - local_d8._0_8_);
          }
          if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          DistanceGraph::get_link
                    ((Link *)local_d8,(DistanceGraph *)this->ws,
                     *(pGVar8->super_GraphEditorOperation).input_ends.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                     *(pGVar8->super_GraphEditorOperation).input_nodes.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start);
          local_8c = local_d8._16_4_;
          DistanceGraph::get_link
                    ((Link *)local_d8,(DistanceGraph *)this->ws,
                     -(pGVar8->super_GraphEditorOperation).input_nodes.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1],
                     (pGVar8->super_GraphEditorOperation).input_ends.
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_start[1]);
          local_90 = local_d8._16_4_;
          if (pGVar8->full_detach == true) {
            local_98 = pGVar8;
            DistanceGraph::get_fw_links
                      ((vector<Link,_std::allocator<Link>_> *)local_d8,(DistanceGraph *)this->ws,
                       -*(pGVar8->super_GraphEditorOperation).input_ends.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start);
            uVar3 = local_d8._8_8_;
            for (pLVar10 = (pointer)local_d8._0_8_; pLVar10 != (pointer)uVar3; pLVar10 = pLVar10 + 1
                ) {
              DistanceGraph::remove_link((DistanceGraph *)this->ws,pLVar10->source,pLVar10->dest);
            }
            if ((pointer)local_d8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_d8._0_8_,
                              CONCAT44(local_d8._20_4_,local_d8._16_4_) - local_d8._0_8_);
            }
            DistanceGraph::get_bw_links
                      ((vector<Link,_std::allocator<Link>_> *)local_d8,(DistanceGraph *)this->ws,
                       (local_98->super_GraphEditorOperation).input_ends.
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start[1]);
            uVar3 = local_d8._8_8_;
            for (pLVar10 = (pointer)local_d8._0_8_; pLVar10 != (pointer)uVar3; pLVar10 = pLVar10 + 1
                ) {
              DistanceGraph::remove_link((DistanceGraph *)this->ws,pLVar10->source,pLVar10->dest);
            }
            pGVar8 = local_98;
            uVar11 = local_b0;
            if ((pointer)local_d8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_d8._0_8_,
                              CONCAT44(local_d8._20_4_,local_d8._16_4_) - local_d8._0_8_);
              pGVar8 = local_98;
              uVar11 = local_b0;
            }
          }
          else {
            DistanceGraph::remove_link
                      ((DistanceGraph *)this->ws,
                       *(pGVar8->super_GraphEditorOperation).input_ends.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                       *(pGVar8->super_GraphEditorOperation).input_nodes.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
            DistanceGraph::remove_link
                      ((DistanceGraph *)this->ws,
                       -(pGVar8->super_GraphEditorOperation).input_nodes.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1],
                       (pGVar8->super_GraphEditorOperation).input_ends.
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start[1]);
          }
          DistanceGraph::add_link
                    ((DistanceGraph *)this->ws,
                     *(pGVar8->super_GraphEditorOperation).input_ends.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,sVar4,local_8c,(Support)ZEXT816(0));
          DistanceGraph::add_link
                    ((DistanceGraph *)this->ws,-sVar4,
                     (pGVar8->super_GraphEditorOperation).input_ends.
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_start[1],local_90,(Support)ZEXT816(0));
          pGVar5 = local_a0;
          pGVar12 = local_a8;
        }
        pGVar8 = pGVar8 + 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < this->next_op);
  }
  std::vector<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>::_M_erase_at_end
            (&this->node_deletion_queue,
             (this->node_deletion_queue).
             super__Vector_base<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>.
             _M_impl.super__Vector_impl_data._M_start);
  std::vector<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>::_M_erase_at_end
            (&this->link_deletion_queue,
             (this->link_deletion_queue).
             super__Vector_base<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>.
             _M_impl.super__Vector_impl_data._M_start);
  std::vector<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>::_M_erase_at_end
            (&this->node_expansion_queue,
             (this->node_expansion_queue).
             super__Vector_base<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::vector<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>::
  _M_erase_at_end(&this->path_detachment_queue,
                  (this->path_detachment_queue).
                  super__Vector_base<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  this->next_op = 0;
  return;
}

Assistant:

void GraphEditor::apply_all() {
    auto next_node_deletion=node_deletion_queue.begin();
    auto next_link_deletion=link_deletion_queue.begin();
    auto next_expansion=node_expansion_queue.begin();
    auto next_detachment=path_detachment_queue.begin();
    for (uint64_t i=0;i<next_op;++i) {
//    sdglib::OutputLog()<<"Applying all graph edits: "<<node_deletion_queue.size()<<" node deletions, "
//            <<link_deletion_queue.size()<<" link deletions, "
//            <<node_expansion_queue.size()<<" node expansions, "
//            <<path_detachment_queue.size()<<" path detachments"<<std::endl;
        if (next_node_deletion!=node_deletion_queue.end() and next_node_deletion->index==i) {
            auto &op=*next_node_deletion;
            ws.sdg.remove_node(llabs(op.input_nodes[0]));
            ++next_node_deletion;
        }
        if (next_link_deletion!=link_deletion_queue.end() and next_link_deletion->index==i) {
            auto &op=*next_link_deletion;
            ws.sdg.remove_link(op.input_ends[0],op.input_ends[1]);
            ++next_link_deletion;
        }
        if (next_expansion!=node_expansion_queue.end() and next_expansion->index==i) {
            auto &op=*next_expansion;
            for (auto li = 0; li < op.input_ends.size() / 2; ++li) {
                //create a copy of the node;
                auto new_node = ws.sdg.add_node(ws.sdg.get_node_sequence(op.input_nodes[0]));
                //connect to the sides
                auto source_dist = ws.sdg.get_link(op.input_ends[2 * li], op.input_nodes[0]).dist;
                ws.sdg.add_link(op.input_ends[2 * li], new_node, source_dist);
                auto dest_dist = ws.sdg.get_link(-op.input_nodes[0], op.input_ends[2 * li + 1]).dist;
                ws.sdg.add_link(-new_node, op.input_ends[2 * li + 1], dest_dist);
            }
            ws.sdg.remove_node(op.input_nodes[0]);
            ++next_expansion;
        }
        if (next_detachment!=path_detachment_queue.end() and next_detachment->index==i) {
            auto &op=*next_detachment;
            //special case: path with just ends
            if (op.input_nodes.empty()) {
                if ( op.full_detach ) {
                    for (auto l:ws.sdg.get_fw_links(-op.input_ends[0]))
                        if (l.dest != op.input_ends[1]) ws.sdg.remove_link(l.source, l.dest);
                    for (auto l:ws.sdg.get_bw_links(op.input_ends[1]))
                        if (l.dest != op.input_ends[0]) ws.sdg.remove_link(l.source, l.dest);

                }
            } else {
                //Create a unitig with the internal path sequence
                auto new_node = ws.sdg.add_node(SequenceDistanceGraphPath(ws.sdg, op.input_nodes).sequence());
                auto first_dist = ws.sdg.get_link(op.input_ends[0], op.input_nodes.front()).dist;
                auto last_dist = ws.sdg.get_link(-op.input_nodes.back(), op.input_ends[1]).dist;
                if ( op.full_detach ) {
                    for (auto l:ws.sdg.get_fw_links(-op.input_ends[0])) ws.sdg.remove_link(l.source, l.dest);
                    for (auto l:ws.sdg.get_bw_links(op.input_ends[1])) ws.sdg.remove_link(l.source, l.dest);
                }
                else {
                    ws.sdg.remove_link(op.input_ends[0], op.input_nodes.front());
                    ws.sdg.remove_link(-op.input_nodes.back(), op.input_ends[1]);
                }
                ws.sdg.add_link(op.input_ends[0], new_node, first_dist);
                ws.sdg.add_link(-new_node, op.input_ends[1], last_dist);
            }
            ++next_detachment;
        }

    }
    node_deletion_queue.clear();
    link_deletion_queue.clear();
    node_expansion_queue.clear();
    path_detachment_queue.clear();
    next_op=0;
}